

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input-xkb.c
# Opt level: O2

void wpe_input_xkb_context_try_ensure_keymap(wpe_input_xkb_context *xkb_context)

{
  long lVar1;
  xkb_state *pxVar2;
  xkb_rule_names names;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  char *local_28;
  char *pcStack_20;
  char *local_18;
  
  if (xkb_context->state != (xkb_state *)0x0) {
    return;
  }
  local_18 = "";
  local_28 = "us";
  pcStack_20 = "";
  local_38 = 0x10709f;
  uStack_34 = 0;
  uStack_30 = 0x1070a5;
  uStack_2c = 0;
  lVar1 = xkb_keymap_new_from_names(xkb_context->context,&local_38,0);
  if (lVar1 != 0) {
    pxVar2 = (xkb_state *)xkb_state_new(lVar1);
    xkb_context->state = pxVar2;
    xkb_keymap_unref(lVar1);
  }
  return;
}

Assistant:

static void
wpe_input_xkb_context_try_ensure_keymap(struct wpe_input_xkb_context* xkb_context)
{
    if (xkb_context->state)
        return;

    struct xkb_rule_names names = { "evdev", "pc105", "us", "", "" };
    struct xkb_keymap* keymap = xkb_keymap_new_from_names(xkb_context->context, &names, XKB_KEYMAP_COMPILE_NO_FLAGS);
    if (keymap) {
        xkb_context->state = xkb_state_new(keymap);
        xkb_keymap_unref(keymap);
    }
}